

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

void __thiscall TCV::visit(TCV *this,CompareOp *node)

{
  string *this_00;
  bool bVar1;
  ASTNode *pAVar2;
  string errorString;
  string local_78;
  string rhsType;
  string lhsType;
  
  pAVar2 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  this_00 = &this->returnType;
  std::__cxx11::string::string((string *)&lhsType,(string *)this_00);
  pAVar2 = AST::ASTNode::getChild(&node->super_ASTNode,2);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  std::__cxx11::string::string((string *)&rhsType,(string *)this_00);
  bVar1 = isMatchType(&lhsType,&rhsType);
  if (!bVar1) {
    std::__cxx11::to_string(&local_78,this->position);
    std::operator+(&errorString,"Unmatched type at line ",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Semantic::Detector::addError(this->detector,&errorString);
    std::__cxx11::string::~string((string *)&errorString);
  }
  errorString._M_dataplus._M_p = (pointer)&errorString.field_2;
  errorString._M_string_length = 0;
  errorString.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)this_00,(string *)&errorString);
  std::__cxx11::string::~string((string *)&errorString);
  std::__cxx11::string::~string((string *)&rhsType);
  std::__cxx11::string::~string((string *)&lhsType);
  return;
}

Assistant:

void TCV::visit(CompareOp *node) {
    node->getChild(0)->accept(*this);
    std::string lhsType = returnType;
    node->getChild(2)->accept(*this);
    std::string rhsType = returnType;
    if (!isMatchType(lhsType, rhsType)) {
        std::string errorString = "Unmatched type at line " + std::to_string(position);
        detector->addError(errorString);
    }
    returnType = std::string();
}